

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dacload.c
# Opt level: O2

int envy_bios_parse_dacload(envy_bios *bios)

{
  uint8_t *res;
  uint8_t *res_00;
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  envy_bios_dacload_entry *peVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  char *__format;
  
  uVar3 = (bios->dacload).offset;
  if (uVar3 == 0) {
LAB_0025173b:
    iVar4 = 0;
  }
  else {
    iVar4 = bios_u8(bios,(uint)uVar3,&(bios->dacload).version);
    res = &(bios->dacload).hlen;
    iVar5 = bios_u8(bios,(bios->dacload).offset + 1,res);
    res_00 = &(bios->dacload).rlen;
    iVar6 = bios_u8(bios,(bios->dacload).offset + 2,res_00);
    iVar7 = bios_u8(bios,(bios->dacload).offset + 3,&(bios->dacload).entriesnum);
    if (iVar7 != 0 || (iVar6 != 0 || (iVar5 != 0 || iVar4 != 0))) {
      return -0xe;
    }
    envy_bios_block(bios,(uint)(bios->dacload).offset,
                    (uint)(bios->dacload).entriesnum * (uint)(bios->dacload).rlen +
                    (uint)(bios->dacload).hlen,"DACLOAD",-1);
    bVar1 = (bios->dacload).version;
    if ((bVar1 & 0xef) == 0) {
      bVar1 = *res;
      uVar11 = (ulong)bVar1;
      if (bVar1 < 4) {
        __format = "DACLOAD table header too short [%d < %d]\n";
        uVar9 = 4;
      }
      else {
        bVar2 = *res_00;
        if (3 < bVar2) {
          if (bVar1 != 4) {
            fprintf(_stderr,"DACLOAD table header longer than expected [%d > %d]\n");
            bVar2 = *res_00;
          }
          if (4 < bVar2) {
            fprintf(_stderr,"DACLOAD table record longer than expected [%d > %d]\n",(ulong)bVar2);
          }
          peVar8 = (envy_bios_dacload_entry *)calloc((ulong)(bios->dacload).entriesnum,8);
          (bios->dacload).entries = peVar8;
          if (peVar8 == (envy_bios_dacload_entry *)0x0) {
            return -0xc;
          }
          bVar1 = (bios->dacload).entriesnum;
          for (uVar9 = 0; uVar9 < bVar1; uVar9 = uVar9 + 1) {
            peVar8 = (bios->dacload).entries;
            uVar10 = (uint)(bios->dacload).rlen * (int)uVar9 +
                     (uint)(bios->dacload).hlen + (uint)(bios->dacload).offset;
            peVar8[uVar9].offset = (uint16_t)uVar10;
            uVar10 = uVar10 & 0xffff;
            if (bios->length <= uVar10 + 3) {
              peVar8[uVar9].val = 0;
              fprintf(_stderr,"requested OOB u32 at 0x%04x\n");
              return -0xe;
            }
            peVar8[uVar9].val = *(uint32_t *)(bios->data + uVar10);
          }
          (bios->dacload).valid = '\x01';
          goto LAB_0025173b;
        }
        __format = "DACLOAD table record too short [%d < %d]\n";
        uVar9 = 4;
        uVar11 = (ulong)(uint)bVar2;
      }
    }
    else {
      uVar11 = (ulong)(bVar1 >> 4);
      uVar9 = (ulong)(bVar1 & 0xf);
      __format = "Unknown DACLOAD table version %d.%d\n";
    }
    fprintf(_stderr,__format,uVar11,uVar9);
    iVar4 = -0x16;
  }
  return iVar4;
}

Assistant:

int envy_bios_parse_dacload (struct envy_bios *bios) {
	struct envy_bios_dacload *dacload = &bios->dacload;
	if (!dacload->offset)
		return 0;
	int err = 0;
	err |= bios_u8(bios, dacload->offset, &dacload->version);
	err |= bios_u8(bios, dacload->offset+1, &dacload->hlen);
	err |= bios_u8(bios, dacload->offset+2, &dacload->rlen);
	err |= bios_u8(bios, dacload->offset+3, &dacload->entriesnum);
	if (err)
		return -EFAULT;
	envy_bios_block(bios, dacload->offset, dacload->hlen + dacload->rlen * dacload->entriesnum, "DACLOAD", -1);
	int wanthlen = 0;
	int wantrlen = 0;
	switch (dacload->version) {
		case 0x00:
		case 0x10:
			wanthlen = 4;
			wantrlen = 4;
			break;
		default:
			ENVY_BIOS_ERR("Unknown DACLOAD table version %d.%d\n", dacload->version >> 4, dacload->version & 0xf);
			return -EINVAL;
	}
	if (dacload->hlen < wanthlen) {
		ENVY_BIOS_ERR("DACLOAD table header too short [%d < %d]\n", dacload->hlen, wanthlen);
		return -EINVAL;
	}
	if (dacload->rlen < wantrlen) {
		ENVY_BIOS_ERR("DACLOAD table record too short [%d < %d]\n", dacload->rlen, wantrlen);
		return -EINVAL;
	}
	if (dacload->hlen > wanthlen) {
		ENVY_BIOS_WARN("DACLOAD table header longer than expected [%d > %d]\n", dacload->hlen, wanthlen);
	}
	if (dacload->rlen > wantrlen) {
		ENVY_BIOS_WARN("DACLOAD table record longer than expected [%d > %d]\n", dacload->rlen, wantrlen);
	}
	dacload->entries = calloc(dacload->entriesnum, sizeof *dacload->entries);
	if (!dacload->entries)
		return -ENOMEM;
	int i;
	for (i = 0; i < dacload->entriesnum; i++) {
		struct envy_bios_dacload_entry *entry = &dacload->entries[i];
		entry->offset = dacload->offset + dacload->hlen + dacload->rlen * i;
		err |= bios_u32(bios, entry->offset, &entry->val);
		if (err)
			return -EFAULT;
	}
	dacload->valid = 1;
	return 0;
}